

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

int luaO_int2fb(uint x)

{
  uint uVar1;
  uint uVar2;
  
  if (7 < x) {
    uVar2 = 8;
    if (0xf < x) {
      do {
        uVar1 = x + 1;
        x = uVar1 >> 1;
        uVar2 = uVar2 + 8;
      } while (0x1f < uVar1);
    }
    x = x - 8 | uVar2;
  }
  return x;
}

Assistant:

int luaO_int2fb (unsigned int x) {
  int e = 0;  /* exponent */
  if (x < 8) return x;
  while (x >= 0x10) {
    x = (x+1) >> 1;
    e++;
  }
  return ((e+1) << 3) | (cast_int(x) - 8);
}